

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

String * __thiscall Value::toJSON(String *__return_storage_ptr__,Value *this,bool pretty)

{
  cJSON *item;
  char *ch;
  undefined7 in_register_00000011;
  
  item = toCJSON(this);
  if ((int)CONCAT71(in_register_00000011,pretty) == 0) {
    ch = cJSON_PrintUnformatted(item);
  }
  else {
    ch = cJSON_Print(item);
  }
  cJSON_Delete(item);
  String::String(__return_storage_ptr__,ch,0xffffffffffffffff);
  free(ch);
  return __return_storage_ptr__;
}

Assistant:

String Value::toJSON(bool pretty) const
{
    cJSON *json = toCJSON(*this);
    char *formatted = (pretty ? cJSON_Print(json) : cJSON_PrintUnformatted(json));
    cJSON_Delete(json);
    const String ret = formatted;
    free(formatted);
    return ret;
}